

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O3

void __thiscall
QtPromisePrivate::PromiseDataBase<const_char_*,_void_(const_char_*const_&)>::~PromiseDataBase
          (PromiseDataBase<const_char_*,_void_(const_char_*const_&)> *this)

{
  this->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_00144850;
  if ((this->m_error).m_data._M_exception_object != (void *)0x0) {
    std::__exception_ptr::exception_ptr::_M_release();
  }
  QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_>_>
  ::~QArrayDataPointer(&(this->m_catchers).d);
  QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_char_*const_&)>_>_>::
  ~QArrayDataPointer((QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_char_*const_&)>_>_>
                      *)&this->m_handlers);
  QReadWriteLock::~QReadWriteLock(&this->m_lock);
  return;
}

Assistant:

virtual ~PromiseDataBase() { }